

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O2

void __thiscall
cappuccino::tlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::do_erase
          (tlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1> *this,
          size_t element_idx)

{
  long lVar1;
  long lVar2;
  _List_node_base *p_Var3;
  uint in_EAX;
  _List_iterator<unsigned_long> _Var4;
  __off64_t *in_R8;
  size_t in_R9;
  
  lVar2 = *(long *)(this + 0x30);
  lVar1 = lVar2 + element_idx * 0x28;
  _Var4 = std::prev<std::_List_iterator<unsigned_long>>(*(_List_node_base **)(this + 200),1);
  p_Var3 = *(_List_node_base **)(lVar2 + 0x10 + element_idx * 0x28);
  if (p_Var3 != _Var4._M_node) {
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::splice
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x80),
               (int)*(undefined8 *)(this + 200),(__off64_t *)(this + 0x80),(int)p_Var3,in_R8,in_R9,
               in_EAX);
  }
  *(undefined8 *)(this + 200) = *(undefined8 *)(*(long *)(this + 200) + 8);
  std::
  _Rb_tree<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>>
  ::erase_abi_cxx11_((_Rb_tree<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>,std::_Select1st<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>>
                      *)(this + 0x98),*(_Base_ptr *)(lVar1 + 0x18));
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)(this + 0x48),
          (const_iterator)
          ((_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> *)(lVar1 + 8))
          ->_M_cur);
  *(long *)(this + 0x28) = *(long *)(this + 0x28) + -1;
  return;
}

Assistant:

auto do_erase(size_t element_idx) -> void
    {
        element& e = m_elements[element_idx];

        // splice into the end position of the LRU if it isn't the last item...
        if (e.m_lru_position != std::prev(m_lru_end))
        {
            m_lru_list.splice(m_lru_end, m_lru_list, e.m_lru_position);
        }
        --m_lru_end;

        m_ttl_list.erase(e.m_ttl_position);

        m_keyed_elements.erase(e.m_keyed_position);

        // destruct e.m_value when re-assigned on an insert.

        --m_used_size;
    }